

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_srtp_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> SVar1;
  int iVar2;
  stack_st_SRTP_PROTECTION_PROFILE *sk;
  Type *pTVar3;
  size_t sVar4;
  bool bVar5;
  int line;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> SVar6;
  uint16_t profile_id;
  StackIterator<stack_st_SRTP_PROTECTION_PROFILE> __begin1;
  CBS profile_ids;
  CBS srtp_mki;
  
  if (contents == (CBS *)0x0) {
LAB_00139f44:
    bVar5 = true;
  }
  else {
    ssl = (SSL *)hs->ssl;
    iVar2 = SSL_is_dtls((SSL *)ssl);
    if (iVar2 == 0) {
      __assert_fail("SSL_is_dtls(ssl)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x696,
                    "bool bssl::ext_srtp_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
    }
    iVar2 = CBS_get_u16_length_prefixed(contents,&profile_ids);
    if ((((iVar2 != 0) && (iVar2 = CBS_get_u16(&profile_ids,&profile_id), iVar2 != 0)) &&
        (profile_ids.len == 0)) &&
       ((iVar2 = CBS_get_u8_length_prefixed(contents,&srtp_mki), iVar2 != 0 && (contents->len == 0))
       )) {
      if (srtp_mki.len == 0) {
        sk = (stack_st_SRTP_PROTECTION_PROFILE *)SSL_get_srtp_profiles(ssl);
        __begin1.idx_ = 0;
        __begin1.sk_ = sk;
        SVar6 = end<stack_st_SRTP_PROTECTION_PROFILE>(sk);
        sVar4 = 0;
        while (SVar1.idx_ = sVar4, SVar1.sk_ = sk, SVar6 != SVar1) {
          pTVar3 = internal::StackIteratorImpl<stack_st_SRTP_PROTECTION_PROFILE>::operator*
                             (&__begin1);
          if (pTVar3->id == (ulong)profile_id) {
            *(Type **)(ssl->handshake_func + 0x280) = pTVar3;
            goto LAB_00139f44;
          }
          sVar4 = __begin1.idx_ + 1;
          sk = __begin1.sk_;
          __begin1.idx_ = sVar4;
        }
        iVar2 = 0x74;
        line = 0x6b1;
      }
      else {
        iVar2 = 0x73;
        line = 0x6a4;
      }
      ERR_put_error(0x10,0,iVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,line);
      *out_alert = '/';
      return false;
    }
    bVar5 = false;
    ERR_put_error(0x10,0,0x74,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x69e);
  }
  return bVar5;
}

Assistant:

static bool ext_srtp_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                       CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    return true;
  }

  // The extension consists of a u16-prefixed profile ID list containing a
  // single uint16_t profile ID, then followed by a u8-prefixed srtp_mki field.
  //
  // See https://tools.ietf.org/html/rfc5764#section-4.1.1
  assert(SSL_is_dtls(ssl));
  CBS profile_ids, srtp_mki;
  uint16_t profile_id;
  if (!CBS_get_u16_length_prefixed(contents, &profile_ids) ||  //
      !CBS_get_u16(&profile_ids, &profile_id) ||               //
      CBS_len(&profile_ids) != 0 ||                            //
      !CBS_get_u8_length_prefixed(contents, &srtp_mki) ||      //
      CBS_len(contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_PROTECTION_PROFILE_LIST);
    return false;
  }

  if (CBS_len(&srtp_mki) != 0) {
    // Must be no MKI, since we never offer one.
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_MKI_VALUE);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  // Check to see if the server gave us something we support and offered.
  for (const SRTP_PROTECTION_PROFILE *profile : SSL_get_srtp_profiles(ssl)) {
    if (profile->id == profile_id) {
      ssl->s3->srtp_profile = profile;
      return true;
    }
  }

  OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_SRTP_PROTECTION_PROFILE_LIST);
  *out_alert = SSL_AD_ILLEGAL_PARAMETER;
  return false;
}